

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::QuadO1::SubGeometry(QuadO1 *this,dim_t codim,dim_t i)

{
  PointerType pdVar1;
  Matrix<double,__1,_2,_0,__1,_2> *pMVar2;
  double dVar3;
  uint uVar4;
  sub_idx_t sVar5;
  QuadO1 *this_00;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *this_01;
  DenseStorage<double,__1,__1,_2,_0> *other;
  _func_int **pp_Var6;
  runtime_error *this_02;
  uint in_ECX;
  _func_int *p_Var7;
  undefined4 in_register_00000034;
  long *plVar8;
  long lVar9;
  stringstream ss;
  undefined1 local_250 [32];
  string local_230;
  RefEl local_20a;
  RefEl local_209;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [3];
  PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_1c8;
  undefined1 local_1b0 [392];
  
  plVar8 = (long *)CONCAT44(in_register_00000034,codim);
  if (i == 2) {
    if (3 < in_ECX) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"i is out of bounds.",0x13);
      pdVar1 = (PointerType)(local_208 + 0x10);
      local_208._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"i >= 0 && i < 4","");
      pMVar2 = (Matrix<double,__1,_2,_0,__1,_2> *)(local_250 + 0x10);
      local_250._0_8_ = pMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_208,(string *)local_250,0xad,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((Matrix<double,__1,_2,_0,__1,_2> *)local_250._0_8_ != pMVar2) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((PointerType)local_208._0_8_ != pdVar1) {
        operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      local_208._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"false","");
      local_250._0_8_ = pMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
      base::AssertionFailed((string *)local_208,(string *)local_250,0xad,&local_230);
      goto LAB_00318627;
    }
    Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b0,
               (Matrix<double,__1,_4,_0,__1,_4> *)(plVar8 + 1),(ulong)in_ECX);
    pp_Var6 = (_func_int **)operator_new(0x18);
    local_208._0_8_ = (PointerType)0x0;
    local_208._8_8_ = (_func_int *)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_208,local_1b0._8_8_
               ,1);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,double,double>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_208,
               (Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b0,
               (assign_op<double,_double> *)local_250);
    p_Var7 = (_func_int *)(local_208._8_8_ - ((long)local_208._8_8_ >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)local_208._8_8_) {
      lVar9 = 0;
      do {
        dVar3 = ((double *)(local_1b0._0_8_ + lVar9 * 8))[1];
        *(double *)(local_208._0_8_ + lVar9 * 8) = *(double *)(local_1b0._0_8_ + lVar9 * 8);
        ((double *)(local_208._0_8_ + lVar9 * 8))[1] = dVar3;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)p_Var7);
    }
    if ((long)p_Var7 < (long)local_208._8_8_) {
      do {
        *(double *)(local_208._0_8_ + (long)p_Var7 * 8) = *(double *)(local_1b0._0_8_ + p_Var7 * 8);
        p_Var7 = p_Var7 + 1;
      } while ((_func_int *)local_208._8_8_ != p_Var7);
    }
    *pp_Var6 = (_func_int *)&PTR_DimLocal_004a19a0;
    pp_Var6[1] = (_func_int *)local_208._0_8_;
    pp_Var6[2] = (_func_int *)local_208._8_8_;
    (this->super_Geometry)._vptr_Geometry = pp_Var6;
  }
  else if (i == 1) {
    if (3 < in_ECX) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"i is out of bounds.",0x13);
      pdVar1 = (PointerType)(local_208 + 0x10);
      local_208._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"i >= 0 && i < 4","");
      pMVar2 = (Matrix<double,__1,_2,_0,__1,_2> *)(local_250 + 0x10);
      local_250._0_8_ = pMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_208,(string *)local_250,0xa6,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((Matrix<double,__1,_2,_0,__1,_2> *)local_250._0_8_ != pMVar2) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((PointerType)local_208._0_8_ != pdVar1) {
        operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      local_208._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"false","");
      local_250._0_8_ = pMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
      base::AssertionFailed((string *)local_208,(string *)local_250,0xa6,&local_230);
      goto LAB_00318627;
    }
    uVar4 = (**(code **)(*plVar8 + 8))(plVar8);
    local_1c8.m_storage.m_data = (double *)0x0;
    local_1c8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
              (&local_1c8,(ulong)uVar4,2);
    local_209.type_ = (**(code **)(*plVar8 + 0x10))(plVar8);
    sVar5 = base::RefEl::SubSubEntity2SubEntity(&local_209,1,in_ECX,1,0);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b0,
               (Matrix<double,__1,_4,_0,__1,_4> *)(plVar8 + 1),(ulong)sVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::
    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>>
              ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)local_250,
               (Matrix<double,__1,_2,_0,__1,_2> *)&local_1c8,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                *)local_1b0);
    local_20a.type_ = (**(code **)(*plVar8 + 0x10))(plVar8);
    sVar5 = base::RefEl::SubSubEntity2SubEntity(&local_20a,1,in_ECX,1,1);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_208,
               (Matrix<double,__1,_4,_0,__1,_4> *)(plVar8 + 1),(ulong)sVar5);
    this_01 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)local_250,
                         (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                          *)local_208);
    other = (DenseStorage<double,__1,__1,_2,_0> *)
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(this_01);
    pp_Var6 = (_func_int **)operator_new(0x18);
    Eigen::DenseStorage<double,_-1,_-1,_2,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_2,_0> *)&local_230,other);
    *pp_Var6 = (_func_int *)&PTR_DimLocal_004a1bd0;
    pp_Var6[1] = (_func_int *)local_230._M_dataplus._M_p;
    pp_Var6[2] = (_func_int *)local_230._M_string_length;
    (this->super_Geometry)._vptr_Geometry = pp_Var6;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_250);
    free(local_1c8.m_storage.m_data);
  }
  else {
    if (i != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"codim is out of bounds.",0x17);
      local_208._0_8_ = local_208 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"false","");
      local_250._0_8_ = (Matrix<double,__1,_2,_0,__1,_2> *)(local_250 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_208,(string *)local_250,0xb0,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((Matrix<double,__1,_2,_0,__1,_2> *)local_250._0_8_ !=
          (Matrix<double,__1,_2,_0,__1,_2> *)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"this code should not be reached");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"i is out of bounds.",0x13);
      pdVar1 = (PointerType)(local_208 + 0x10);
      local_208._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"i == 0","");
      pMVar2 = (Matrix<double,__1,_2,_0,__1,_2> *)(local_250 + 0x10);
      local_250._0_8_ = pMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_208,(string *)local_250,0xa3,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((Matrix<double,__1,_2,_0,__1,_2> *)local_250._0_8_ != pMVar2) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((PointerType)local_208._0_8_ != pdVar1) {
        operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      local_208._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"false","");
      local_250._0_8_ = pMVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,"");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
      base::AssertionFailed((string *)local_208,(string *)local_250,0xa3,&local_230);
LAB_00318627:
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::~string((string *)local_208);
      abort();
    }
    this_00 = (QuadO1 *)operator_new(0x18);
    Eigen::DenseStorage<double,_-1,_-1,_4,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_4,_0> *)local_1b0,
               (DenseStorage<double,__1,__1,_4,_0> *)(plVar8 + 1));
    QuadO1(this_00,(Matrix<double,__1,_4,_0,__1,_4> *)local_1b0);
    free((void *)local_1b0._0_8_);
    (this->super_Geometry)._vptr_Geometry = (_func_int **)this_00;
  }
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> QuadO1::SubGeometry(dim_t codim, dim_t i) const {
  using std::make_unique;
  switch (codim) {
    case 0:
      LF_ASSERT_MSG(i == 0, "i is out of bounds.");
      return std::make_unique<QuadO1>(coords_);
    case 1:
      LF_ASSERT_MSG(i >= 0 && i < 4, "i is out of bounds.");
      return make_unique<SegmentO1>(
          (Eigen::Matrix<double, Eigen::Dynamic, 2>(DimGlobal(), 2)
               << coords_.col(RefEl().SubSubEntity2SubEntity(1, i, 1, 0)),
           coords_.col(RefEl().SubSubEntity2SubEntity(1, i, 1, 1)))
              .finished());
    case 2:
      LF_ASSERT_MSG(i >= 0 && i < 4, "i is out of bounds.");
      return make_unique<Point>(coords_.col(i));
    default:
      LF_VERIFY_MSG(false, "codim is out of bounds.");
  }
}